

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O2

FilterInfo * __thiscall helics::FilterFederate::getFilterInfo(FilterFederate *this,GlobalHandle id)

{
  FilterInfo *pFVar1;
  GlobalHandle local_8;
  
  local_8 = id;
  pFVar1 = gmlc::containers::MappedPointerVector<helics::FilterInfo,_helics::GlobalHandle>::find
                     (&this->filters,&local_8);
  return pFVar1;
}

Assistant:

FilterInfo* FilterFederate::getFilterInfo(GlobalHandle id)
{
    return filters.find(id);
}